

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreCacheHandler.h
# Opt level: O2

void __thiscall
irr::video::
COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
::setBlendEquation(COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                   *this,GLenum mode)

{
  GLenum *pGVar1;
  GLuint i;
  code *pcVar2;
  ulong uVar3;
  
  pGVar1 = this->BlendEquation;
  if ((*pGVar1 != mode) || (this->BlendEquationInvalid == true)) {
    pcVar2 = *(code **)&this->Driver->field_0xac8;
    if ((pcVar2 != (code *)0x0) ||
       (pcVar2 = *(code **)&this->Driver->field_0xac0, pcVar2 != (code *)0x0)) {
      (*pcVar2)(mode);
      pGVar1 = this->BlendEquation;
    }
    for (uVar3 = 0; uVar3 < this->FrameBufferCount; uVar3 = uVar3 + 1) {
      pGVar1[uVar3] = mode;
    }
    this->BlendEquationInvalid = false;
  }
  return;
}

Assistant:

void setBlendEquation(GLenum mode)
	{
		if (BlendEquation[0] != mode || BlendEquationInvalid) {
			Driver->irrGlBlendEquation(mode);

			for (GLuint i = 0; i < FrameBufferCount; ++i)
				BlendEquation[i] = mode;

			BlendEquationInvalid = false;
		}
	}